

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

int queue_segment_start(mixed_segment *segment)

{
  uint uVar1;
  void *pvVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  
  pvVar2 = segment->data;
  if (*(uint *)((long)pvVar2 + 0x18) != 0) {
    bVar3 = 0;
    do {
      if (*(long *)(*(long *)((long)pvVar2 + 0x10) + (ulong)bVar3 * 8) == 0) {
        mixed_err(0x16);
        return 0;
      }
      bVar3 = bVar3 + 1;
    } while ((uint)bVar3 < *(uint *)((long)pvVar2 + 0x18));
  }
  uVar1 = *(uint *)((long)pvVar2 + 0x28);
  bVar5 = uVar1 == 0;
  if (!bVar5) {
    if (**(long **)((long)pvVar2 + 0x20) != 0) {
      bVar3 = 1;
      do {
        uVar4 = (ulong)bVar3;
        bVar5 = uVar1 <= bVar3;
        if (uVar1 <= bVar3) goto LAB_00143316;
        bVar3 = bVar3 + 1;
      } while ((*(long **)((long)pvVar2 + 0x20))[uVar4] != 0);
    }
    mixed_err(0x16);
  }
LAB_00143316:
  return (uint)bVar5;
}

Assistant:

int queue_segment_start(struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  for(mixed_channel_t i=0; i<data->out_count; ++i){
    if(data->out[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  for(mixed_channel_t i=0; i<data->in_count; ++i){
    if(data->in[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}